

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall cmCTest::UpdateCTestConfiguration(cmCTest *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  mapped_type *pmVar5;
  string line;
  string fileName;
  string key;
  string local_680;
  string value;
  ifstream fin;
  size_type local_638;
  byte abStack_620 [488];
  ostringstream cmCTestLog_msg;
  undefined7 uStack_437;
  size_type local_430;
  
  if (this->SuppressUpdatingCTestConfiguration != false) {
    return true;
  }
  std::__cxx11::string::string((string *)&fileName,(string *)&this->CTestConfigFile);
  if (fileName._M_string_length == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,&this->BinaryDir,"/CTestConfiguration.ini");
    std::__cxx11::string::operator=((string *)&fileName,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    bVar1 = cmsys::SystemTools::FileExists(fileName._M_dataplus._M_p);
    if (!bVar1) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg,&this->BinaryDir,"/DartConfiguration.tcl");
      std::__cxx11::string::operator=((string *)&fileName,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"UpdateCTestConfiguration  from :");
  poVar3 = std::operator<<(poVar3,(string *)&fileName);
  std::operator<<(poVar3,"\n");
  std::__cxx11::stringbuf::str();
  Log(this,4,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x27d,_fin,false);
  std::__cxx11::string::~string((string *)&fin);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  bVar1 = cmsys::SystemTools::FileExists(fileName._M_dataplus._M_p);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Parse Config file:");
    poVar3 = std::operator<<(poVar3,(string *)&fileName);
    std::operator<<(poVar3,"\n");
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x287,_fin,false);
    std::__cxx11::string::~string((string *)&fin);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::ifstream::ifstream(&fin,fileName._M_dataplus._M_p,_S_in);
    lVar4 = *(long *)(_fin + -0x18);
    if ((abStack_620[lVar4] & 5) != 0) {
      std::ifstream::~ifstream(&fin);
LAB_002db73d:
      bVar1 = false;
      goto LAB_002dbbba;
    }
    while ((abStack_620[lVar4] & 5) == 0) {
      cmCTestLog_msg = (ostringstream)0x0;
      std::istream::getline((char *)&fin,(long)&cmCTestLog_msg);
      std::__cxx11::string::string((string *)&key,(char *)&cmCTestLog_msg,(allocator *)&value);
      CleanString(&line,&key);
      std::__cxx11::string::~string((string *)&key);
      if (line._M_string_length != 0) {
        while (((abStack_620[*(long *)(_fin + -0x18)] & 5) == 0 &&
               (line._M_dataplus._M_p[line._M_string_length - 1] == '\\'))) {
          std::__cxx11::string::substr((ulong)&key,(ulong)&line);
          std::__cxx11::string::operator=((string *)&line,(string *)&key);
          std::__cxx11::string::~string((string *)&key);
          cmCTestLog_msg = (ostringstream)0x0;
          std::istream::getline((char *)&fin,(long)&cmCTestLog_msg);
          std::__cxx11::string::string
                    ((string *)&value,(char *)&cmCTestLog_msg,(allocator *)&local_680);
          CleanString(&key,&value);
          std::__cxx11::string::append((string *)&line);
          std::__cxx11::string::~string((string *)&key);
          std::__cxx11::string::~string((string *)&value);
        }
        if ((*line._M_dataplus._M_p != '#') &&
           (lVar4 = std::__cxx11::string::find((char)&line,0x3a), lVar4 != -1)) {
          std::__cxx11::string::substr((ulong)&key,(ulong)&line);
          std::__cxx11::string::substr((ulong)&local_680,(ulong)&line);
          CleanString(&value,&local_680);
          std::__cxx11::string::~string((string *)&local_680);
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&this->CTestConfiguration,&key);
          std::__cxx11::string::_M_assign((string *)pmVar5);
          std::__cxx11::string::~string((string *)&value);
          std::__cxx11::string::~string((string *)&key);
        }
      }
      std::__cxx11::string::~string((string *)&line);
      lVar4 = *(long *)(_fin + -0x18);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&fin);
  }
  else if (this->ProduceXML == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Cannot find file: ");
    poVar3 = std::operator<<(poVar3,(string *)&fileName);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::stringbuf::str();
    Log(this,6,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x282,_fin,false);
    std::__cxx11::string::~string((string *)&fin);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    goto LAB_002db73d;
  }
  std::__cxx11::string::string((string *)&fin,"BuildDirectory",(allocator *)&line);
  GetCTestConfiguration((string *)&cmCTestLog_msg,this,(string *)&fin);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&fin);
  if (local_430 != 0) {
    std::__cxx11::string::string((string *)&fin,"BuildDirectory",(allocator *)&line);
    GetCTestConfiguration((string *)&cmCTestLog_msg,this,(string *)&fin);
    std::__cxx11::string::operator=((string *)&this->BinaryDir,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&fin);
    cmsys::SystemTools::ChangeDirectory(&this->BinaryDir);
  }
  std::__cxx11::string::string((string *)&fin,"TimeOut",(allocator *)&line);
  GetCTestConfiguration((string *)&cmCTestLog_msg,this,(string *)&fin);
  iVar2 = atoi((char *)CONCAT71(uStack_437,cmCTestLog_msg));
  this->TimeOut = (double)iVar2;
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&fin);
  std::__cxx11::string::string((string *)&cmCTestLog_msg,"TestLoad",(allocator *)&line);
  GetCTestConfiguration((string *)&fin,this,(string *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  if (local_638 != 0) {
    bVar1 = cmSystemTools::StringToULong(_fin,(unsigned_long *)&key);
    if (bVar1) {
      this->TestLoad = (unsigned_long)key._M_dataplus._M_p;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,"Invalid value for \'Test Load\' : ");
      poVar3 = std::operator<<(poVar3,(string *)&fin);
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::stringbuf::str();
      Log(this,5,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x2b8,line._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
  }
  if (this->ProduceXML == true) {
    std::__cxx11::string::string((string *)&line,"CompressSubmission",(allocator *)&key);
    GetCTestConfiguration((string *)&cmCTestLog_msg,this,&line);
    bVar1 = cmSystemTools::IsOn((char *)CONCAT71(uStack_437,cmCTestLog_msg));
    this->CompressXMLFiles = bVar1;
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&line);
  }
  std::__cxx11::string::~string((string *)&fin);
  bVar1 = true;
LAB_002dbbba:
  std::__cxx11::string::~string((string *)&fileName);
  return bVar1;
}

Assistant:

bool cmCTest::UpdateCTestConfiguration()
{
  if (this->SuppressUpdatingCTestConfiguration) {
    return true;
  }
  std::string fileName = this->CTestConfigFile;
  if (fileName.empty()) {
    fileName = this->BinaryDir + "/CTestConfiguration.ini";
    if (!cmSystemTools::FileExists(fileName.c_str())) {
      fileName = this->BinaryDir + "/DartConfiguration.tcl";
    }
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "UpdateCTestConfiguration  from :" << fileName << "\n");
  if (!cmSystemTools::FileExists(fileName.c_str())) {
    // No need to exit if we are not producing XML
    if (this->ProduceXML) {
      cmCTestLog(this, ERROR_MESSAGE, "Cannot find file: " << fileName
                                                           << std::endl);
      return false;
    }
  } else {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Parse Config file:" << fileName
                                                                  << "\n");
    // parse the dart test file
    cmsys::ifstream fin(fileName.c_str());

    if (!fin) {
      return false;
    }

    char buffer[1024];
    while (fin) {
      buffer[0] = 0;
      fin.getline(buffer, 1023);
      buffer[1023] = 0;
      std::string line = cmCTest::CleanString(buffer);
      if (line.empty()) {
        continue;
      }
      while (fin && (line[line.size() - 1] == '\\')) {
        line = line.substr(0, line.size() - 1);
        buffer[0] = 0;
        fin.getline(buffer, 1023);
        buffer[1023] = 0;
        line += cmCTest::CleanString(buffer);
      }
      if (line[0] == '#') {
        continue;
      }
      std::string::size_type cpos = line.find_first_of(':');
      if (cpos == std::string::npos) {
        continue;
      }
      std::string key = line.substr(0, cpos);
      std::string value = cmCTest::CleanString(line.substr(cpos + 1));
      this->CTestConfiguration[key] = value;
    }
    fin.close();
  }
  if (!this->GetCTestConfiguration("BuildDirectory").empty()) {
    this->BinaryDir = this->GetCTestConfiguration("BuildDirectory");
    cmSystemTools::ChangeDirectory(this->BinaryDir);
  }
  this->TimeOut = atoi(this->GetCTestConfiguration("TimeOut").c_str());
  std::string const& testLoad = this->GetCTestConfiguration("TestLoad");
  if (!testLoad.empty()) {
    unsigned long load;
    if (cmSystemTools::StringToULong(testLoad.c_str(), &load)) {
      this->SetTestLoad(load);
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for 'Test Load' : " << testLoad << std::endl);
    }
  }
  if (this->ProduceXML) {
    this->CompressXMLFiles = cmSystemTools::IsOn(
      this->GetCTestConfiguration("CompressSubmission").c_str());
  }
  return true;
}